

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall
cmCTestSVN::ExternalParser::ExternalParser(ExternalParser *this,cmCTestSVN *svn,char *prefix)

{
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__ExternalParser_0069a640;
  this->SVN = svn;
  (this->RegexExternal).regmatch.startp[0] = (char *)0x0;
  (this->RegexExternal).regmatch.endp[0] = (char *)0x0;
  (this->RegexExternal).regmatch.searchstring = (char *)0x0;
  (this->RegexExternal).program = (char *)0x0;
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(svn->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexExternal,"^X..... +(.+)$");
  return;
}

Assistant:

ExternalParser(cmCTestSVN* svn, const char* prefix)
    : SVN(svn)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexExternal.compile("^X..... +(.+)$");
  }